

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

AActor * P_OldSpawnMissile(AActor *source,AActor *owner,AActor *dest,PClassActor *type)

{
  double dVar1;
  BYTE BVar2;
  AActor *missile;
  double dVar3;
  double dVar4;
  _func_int **local_40;
  PClass *pPStack_38;
  DObject *local_30;
  
  if (type == (PClassActor *)0x0 || source == (AActor *)0x0) {
    missile = (AActor *)0x0;
  }
  else {
    local_30 = (DObject *)((source->__Pos).Z + 32.0);
    local_40 = (_func_int **)(source->__Pos).X;
    pPStack_38 = (PClass *)(source->__Pos).Y;
    missile = AActor::StaticSpawn(type,(DVector3 *)&stack0xffffffffffffffc0,ALLOW_REPLACE,false);
    P_PlaySpawnSound(missile,source);
    (missile->target).field_0.p = owner;
    AActor::AngleTo((AActor *)&stack0xffffffffffffffc0,source,SUB81(dest,0));
    (missile->Angles).Yaw.Degrees = (double)local_40;
    AActor::VelFromAngle(missile);
    dVar3 = 1.0;
    if (1.0 <= missile->Speed) {
      dVar3 = missile->Speed;
    }
    dVar4 = AActor::Distance2D(source,dest,false);
    dVar1 = 1.0;
    if (1.0 <= dVar4 / dVar3) {
      dVar1 = dVar4 / dVar3;
    }
    (missile->Vel).Z = ((dest->__Pos).Z - (source->__Pos).Z) / dVar1;
    if (((missile->flags4).Value & 0x40000) != 0) {
      if (owner->player == (player_t *)0x0) {
        BVar2 = '\0';
      }
      else {
        BVar2 = (char)((int)owner->player + 0xfe81a1b0U >> 5) * '=' + '\x01';
      }
      missile->FriendPlayer = BVar2;
    }
    P_CheckMissileSpawn(missile,source->radius);
  }
  return missile;
}

Assistant:

AActor *P_OldSpawnMissile(AActor *source, AActor *owner, AActor *dest, PClassActor *type)
{
	if (source == nullptr || type == nullptr)
	{
		return nullptr;
	}
	AActor *th = Spawn (type, source->PosPlusZ(32.), ALLOW_REPLACE);

	P_PlaySpawnSound(th, source);
	th->target = owner;		// record missile's originator

	th->Angles.Yaw = source->AngleTo(dest);
	th->VelFromAngle();


	double dist = source->DistanceBySpeed(dest, MAX(1., th->Speed));
	th->Vel.Z = (dest->Z() - source->Z()) / dist;

	if (th->flags4 & MF4_SPECTRAL)
	{
		th->SetFriendPlayer(owner->player);
	}

	P_CheckMissileSpawn(th, source->radius);
	return th;
}